

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitterBeam.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::EmitterBeam::ClearTrackedJammedTargets(EmitterBeam *this)

{
  std::
  vector<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>
  ::clear(&this->m_vTrackJamTargets);
  this->m_ui8NumTargetInTrackJamField = '\0';
  this->m_ui8BeamDataLength = '\r';
  return;
}

Assistant:

void EmitterBeam::ClearTrackedJammedTargets()
{
    m_vTrackJamTargets.clear();
    m_ui8NumTargetInTrackJamField = 0;
    m_ui8BeamDataLength = EMITTER_BEAM_SIZE / 4; 
}